

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy.c
# Opt level: O1

_Bool upb_Message_DeepCopy
                (upb_Message *dst,upb_Message *src,upb_MiniTable *mini_table,upb_Arena *arena)

{
  undefined4 *puVar1;
  upb_Message *puVar2;
  upb_Message_Internal *in;
  
  puVar1 = (undefined4 *)(dst->field_0).internal_opaque;
  if (((ulong)puVar1 & 1) == 0) {
    memset(dst,0,(ulong)mini_table->size_dont_copy_me__upb_internal_use_only);
    if (puVar1 != (undefined4 *)0x0) {
      *puVar1 = 0;
    }
    puVar2 = _upb_Message_Copy(dst,src,mini_table,arena);
    return puVar2 != (upb_Message *)0x0;
  }
  __assert_fail("!upb_Message_IsFrozen(dst)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy.c"
                ,0x12e,
                "_Bool upb_Message_DeepCopy(upb_Message *, const upb_Message *, const upb_MiniTable *, upb_Arena *)"
               );
}

Assistant:

bool upb_Message_DeepCopy(upb_Message* dst, const upb_Message* src,
                          const upb_MiniTable* mini_table, upb_Arena* arena) {
  UPB_ASSERT(!upb_Message_IsFrozen(dst));
  upb_Message_Clear(dst, mini_table);
  return _upb_Message_Copy(dst, src, mini_table, arena) != NULL;
}